

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cted_tree_index_impl.h
# Opt level: O3

double __thiscall
ted_ub::CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>::ted
          (CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
           *this,TreeIndexSCTED *t1,TreeIndexSCTED *t2)

{
  Matrix<double> *this_00;
  Matrix<double> *this_01;
  Matrix<double> *this_02;
  long lVar1;
  longlong *plVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  pointer pdVar6;
  pointer pdVar7;
  uint uVar8;
  uint uVar9;
  double *pdVar10;
  pointer piVar11;
  pointer pvVar12;
  ulong uVar13;
  pointer pvVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  size_t col;
  size_type columns;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vector<double,_std::allocator<double>_> dt2;
  vector<double,_std::allocator<double>_> df2;
  allocator_type local_c9;
  size_t local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  pointer local_98;
  vector<double,_std::allocator<double>_> local_90;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>).
  subproblem_counter_ = 0;
  iVar33 = (t1->super_Constants).tree_size_;
  local_c8 = (size_t)iVar33;
  iVar34 = (t2->super_Constants).tree_size_;
  local_c0 = (size_t)iVar34;
  uVar8 = iVar33 + 1;
  sVar18 = (size_t)(int)uVar8;
  uVar9 = iVar34 + 1;
  columns = (size_type)(int)uVar9;
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b8,sVar18,columns);
  (this->dt_).rows_ = local_b8._0_8_;
  (this->dt_).columns_ = local_b8._8_8_;
  pdVar6 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  local_98 = (pointer)0x0;
  local_a8 = ZEXT816(0);
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b8,sVar18,columns);
  (this->df_).rows_ = local_b8._0_8_;
  (this->df_).columns_ = local_b8._8_8_;
  pdVar6 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  local_a8 = ZEXT816(0);
  local_98 = (pointer)0x0;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
    }
  }
  data_structures::Matrix<double>::Matrix((Matrix<double> *)local_b8,sVar18,columns);
  (this->e_).rows_ = local_b8._0_8_;
  (this->e_).columns_ = local_b8._8_8_;
  pdVar6 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
    }
  }
  auVar36 = _DAT_00123050;
  auVar29 = _DAT_00123040;
  pdVar6 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar7) {
    uVar13 = (long)pdVar7 + (-8 - (long)pdVar6);
    auVar41._8_4_ = (int)uVar13;
    auVar41._0_8_ = uVar13;
    auVar41._12_4_ = (int)(uVar13 >> 0x20);
    auVar21._0_8_ = uVar13 >> 3;
    auVar21._8_8_ = auVar41._8_8_ >> 3;
    uVar15 = 0;
    auVar21 = auVar21 ^ _DAT_00123050;
    do {
      auVar40._8_4_ = (int)uVar15;
      auVar40._0_8_ = uVar15;
      auVar40._12_4_ = (int)(uVar15 >> 0x20);
      auVar41 = (auVar40 | auVar29) ^ auVar36;
      if ((bool)(~(auVar41._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar41._0_4_ ||
                  auVar21._4_4_ < auVar41._4_4_) & 1)) {
        pdVar6[uVar15] = INFINITY;
      }
      if ((auVar41._12_4_ != auVar21._12_4_ || auVar41._8_4_ <= auVar21._8_4_) &&
          auVar41._12_4_ <= auVar21._12_4_) {
        pdVar6[uVar15 + 1] = INFINITY;
      }
      uVar15 = uVar15 + 2;
    } while (((uVar13 >> 3) + 2 & 0x3ffffffffffffffe) != uVar15);
  }
  auVar36 = _DAT_00123050;
  auVar29 = _DAT_00123040;
  pdVar6 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar7) {
    uVar13 = (long)pdVar7 + (-8 - (long)pdVar6);
    auVar22._8_4_ = (int)uVar13;
    auVar22._0_8_ = uVar13;
    auVar22._12_4_ = (int)(uVar13 >> 0x20);
    auVar23._0_8_ = uVar13 >> 3;
    auVar23._8_8_ = auVar22._8_8_ >> 3;
    uVar15 = 0;
    auVar23 = auVar23 ^ _DAT_00123050;
    do {
      auVar42._8_4_ = (int)uVar15;
      auVar42._0_8_ = uVar15;
      auVar42._12_4_ = (int)(uVar15 >> 0x20);
      auVar41 = (auVar42 | auVar29) ^ auVar36;
      if ((bool)(~(auVar41._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar41._0_4_ ||
                  auVar23._4_4_ < auVar41._4_4_) & 1)) {
        pdVar6[uVar15] = INFINITY;
      }
      if ((auVar41._12_4_ != auVar23._12_4_ || auVar41._8_4_ <= auVar23._8_4_) &&
          auVar41._12_4_ <= auVar23._12_4_) {
        pdVar6[uVar15 + 1] = INFINITY;
      }
      uVar15 = uVar15 + 2;
    } while (((uVar13 >> 3) + 2 & 0x3ffffffffffffffe) != uVar15);
  }
  auVar36 = _DAT_00123050;
  auVar29 = _DAT_00123040;
  pdVar6 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar7) {
    uVar13 = (long)pdVar7 + (-8 - (long)pdVar6);
    auVar24._8_4_ = (int)uVar13;
    auVar24._0_8_ = uVar13;
    auVar24._12_4_ = (int)(uVar13 >> 0x20);
    auVar25._0_8_ = uVar13 >> 3;
    auVar25._8_8_ = auVar24._8_8_ >> 3;
    uVar15 = 0;
    auVar25 = auVar25 ^ _DAT_00123050;
    do {
      auVar43._8_4_ = (int)uVar15;
      auVar43._0_8_ = uVar15;
      auVar43._12_4_ = (int)(uVar15 >> 0x20);
      auVar41 = (auVar43 | auVar29) ^ auVar36;
      if ((bool)(~(auVar41._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar41._0_4_ ||
                  auVar25._4_4_ < auVar41._4_4_) & 1)) {
        pdVar6[uVar15] = INFINITY;
      }
      if ((auVar41._12_4_ != auVar25._12_4_ || auVar41._8_4_ <= auVar25._8_4_) &&
          auVar41._12_4_ <= auVar25._12_4_) {
        pdVar6[uVar15 + 1] = INFINITY;
      }
      uVar15 = uVar15 + 2;
    } while (((uVar13 >> 3) + 2 & 0x3ffffffffffffffe) != uVar15);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b8,columns,(allocator_type *)&local_90
            );
  std::vector<double,_std::allocator<double>_>::vector(&local_90,columns,&local_c9);
  this_00 = &this->dt_;
  pdVar10 = data_structures::Matrix<double>::at(this_00,0,0);
  this_01 = &this->df_;
  *pdVar10 = 0.0;
  pdVar10 = data_structures::Matrix<double>::at(this_01,0,0);
  *pdVar10 = 0.0;
  if (0 < (int)local_c8) {
    sVar18 = 1;
    do {
      pdVar10 = data_structures::Matrix<double>::at(this_01,sVar18,0);
      *pdVar10 = 0.0;
      pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar11 = *(pointer *)
                 &pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar11) {
        uVar17 = 2;
        do {
          pdVar10 = data_structures::Matrix<double>::at(this_00,(long)piVar11[uVar17 - 2] + 1,0);
          dVar19 = *pdVar10;
          pdVar10 = data_structures::Matrix<double>::at(this_01,sVar18,0);
          *pdVar10 = dVar19 + *pdVar10;
          uVar13 = (ulong)uVar17;
          pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar11 = *(pointer *)
                     &pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar17 = uVar17 + 1;
        } while (uVar13 <= (ulong)((long)*(pointer *)
                                          ((long)&pvVar14[sVar18 - 1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar11 >> 2));
      }
      pdVar10 = data_structures::Matrix<double>::at(this_01,sVar18,0);
      dVar19 = *pdVar10;
      pdVar10 = data_structures::Matrix<double>::at(this_00,sVar18,0);
      *pdVar10 = dVar19 + 1.0;
      sVar18 = sVar18 + 1;
    } while (sVar18 != uVar8);
  }
  if (0 < (int)local_c0) {
    sVar18 = 1;
    do {
      pdVar10 = data_structures::Matrix<double>::at(this_01,0,sVar18);
      *pdVar10 = 0.0;
      pvVar14 = (t2->super_PostLToChildren).postl_to_children_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar11 = *(pointer *)
                 &pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar11) {
        uVar17 = 2;
        do {
          pdVar10 = data_structures::Matrix<double>::at(this_00,0,(long)piVar11[uVar17 - 2] + 1);
          dVar19 = *pdVar10;
          pdVar10 = data_structures::Matrix<double>::at(this_01,0,sVar18);
          *pdVar10 = dVar19 + *pdVar10;
          uVar13 = (ulong)uVar17;
          pvVar14 = (t2->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar11 = *(pointer *)
                     &pvVar14[sVar18 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar17 = uVar17 + 1;
        } while (uVar13 <= (ulong)((long)*(pointer *)
                                          ((long)&pvVar14[sVar18 - 1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar11 >> 2));
      }
      pdVar10 = data_structures::Matrix<double>::at(this_01,0,sVar18);
      dVar19 = *pdVar10;
      pdVar10 = data_structures::Matrix<double>::at(this_00,0,sVar18);
      *pdVar10 = dVar19 + 1.0;
      sVar18 = sVar18 + 1;
    } while (sVar18 != uVar9);
  }
  if (0 < (int)local_c8) {
    this_02 = &this->e_;
    local_58 = (ulong)uVar8;
    local_50 = (ulong)uVar9;
    uVar13 = 1;
    do {
      if (local_b8._0_8_ != local_b8._8_8_) {
        uVar15 = local_b8._8_8_ + (-8 - local_b8._0_8_);
        auVar29._8_4_ = (int)uVar15;
        auVar29._0_8_ = uVar15;
        auVar29._12_4_ = (int)(uVar15 >> 0x20);
        auVar36._0_8_ = uVar15 >> 3;
        auVar36._8_8_ = auVar29._8_8_ >> 3;
        uVar16 = 0;
        do {
          auVar28._8_4_ = (int)uVar16;
          auVar28._0_8_ = uVar16;
          auVar28._12_4_ = (int)(uVar16 >> 0x20);
          auVar41 = auVar36 ^ _DAT_00123050;
          auVar29 = (auVar28 | _DAT_00123040) ^ _DAT_00123050;
          auVar38._0_4_ = -(uint)(auVar41._0_4_ < auVar29._0_4_);
          auVar38._4_4_ = -(uint)(auVar41._4_4_ < auVar29._4_4_);
          auVar38._8_4_ = -(uint)(auVar41._8_4_ < auVar29._8_4_);
          auVar38._12_4_ = -(uint)(auVar41._12_4_ < auVar29._12_4_);
          iVar33 = -(uint)(auVar29._4_4_ == auVar41._4_4_);
          iVar34 = -(uint)(auVar29._12_4_ == auVar41._12_4_);
          auVar35._4_4_ = iVar33;
          auVar35._0_4_ = iVar33;
          auVar35._8_4_ = iVar34;
          auVar35._12_4_ = iVar34;
          auVar30._4_4_ = auVar38._4_4_;
          auVar30._0_4_ = auVar38._4_4_;
          auVar30._8_4_ = auVar38._12_4_;
          auVar30._12_4_ = auVar38._12_4_;
          auVar30 = auVar30 | auVar35 & auVar38;
          if ((~auVar30._0_4_ & 1) != 0) {
            *(double *)(local_b8._0_8_ + uVar16 * 8) = INFINITY;
          }
          if (((auVar30 ^ _DAT_001230f0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(double *)(local_b8._0_8_ + (uVar16 + 1) * 8) = INFINITY;
          }
          uVar16 = uVar16 + 2;
        } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar16);
      }
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar15 = (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-8 - (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
        auVar26._8_4_ = (int)uVar15;
        auVar26._0_8_ = uVar15;
        auVar26._12_4_ = (int)(uVar15 >> 0x20);
        auVar27._0_8_ = uVar15 >> 3;
        auVar27._8_8_ = auVar26._8_8_ >> 3;
        uVar16 = 0;
        do {
          auVar31._8_4_ = (int)uVar16;
          auVar31._0_8_ = uVar16;
          auVar31._12_4_ = (int)(uVar16 >> 0x20);
          auVar36 = auVar27 ^ _DAT_00123050;
          auVar29 = (auVar31 | _DAT_00123040) ^ _DAT_00123050;
          auVar39._0_4_ = -(uint)(auVar36._0_4_ < auVar29._0_4_);
          auVar39._4_4_ = -(uint)(auVar36._4_4_ < auVar29._4_4_);
          auVar39._8_4_ = -(uint)(auVar36._8_4_ < auVar29._8_4_);
          auVar39._12_4_ = -(uint)(auVar36._12_4_ < auVar29._12_4_);
          iVar33 = -(uint)(auVar29._4_4_ == auVar36._4_4_);
          iVar34 = -(uint)(auVar29._12_4_ == auVar36._12_4_);
          auVar37._4_4_ = iVar33;
          auVar37._0_4_ = iVar33;
          auVar37._8_4_ = iVar34;
          auVar37._12_4_ = iVar34;
          auVar32._4_4_ = auVar39._4_4_;
          auVar32._0_4_ = auVar39._4_4_;
          auVar32._8_4_ = auVar39._12_4_;
          auVar32._12_4_ = auVar39._12_4_;
          auVar32 = auVar32 | auVar37 & auVar39;
          if ((~auVar32._0_4_ & 1) != 0) {
            local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] = INFINITY;
          }
          if (((auVar32 ^ _DAT_001230f0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16 + 1] = INFINITY;
          }
          uVar16 = uVar16 + 2;
        } while (((uVar15 >> 3) + 2 & 0x3ffffffffffffffe) != uVar16);
      }
      if (0 < (int)local_c0) {
        lVar1 = uVar13 - 1;
        uVar15 = 1;
        local_48 = uVar13;
        do {
          pdVar10 = data_structures::Matrix<double>::at(this_02,0,0);
          *pdVar10 = 0.0;
          pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar14[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar14[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            sVar18 = 1;
            uVar8 = 2;
            do {
              pdVar10 = data_structures::Matrix<double>::at(this_02,(ulong)(uVar8 - 2),0);
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at
                                  (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar8 - 2) * 4) + 1,0);
              dVar4 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_02,sVar18,0);
              *pdVar10 = dVar19 + dVar4;
              pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar18 = (size_t)uVar8;
              uVar8 = uVar8 + 1;
            } while (sVar18 <= (ulong)((long)*(pointer *)
                                              ((long)&pvVar14[lVar1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar14[lVar1].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2));
          }
          lVar3 = uVar15 - 1;
          pvVar12 = (t2->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar12[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar12[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            sVar18 = 1;
            uVar8 = 2;
            do {
              pdVar10 = data_structures::Matrix<double>::at(this_02,0,(ulong)(uVar8 - 2));
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at
                                  (this_00,0,
                                   (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                            postl_to_children_.
                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar8 - 2) * 4) + 1);
              dVar4 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_02,0,sVar18);
              *pdVar10 = dVar19 + dVar4;
              pvVar12 = (t2->super_PostLToChildren).postl_to_children_.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar18 = (size_t)uVar8;
              uVar8 = uVar8 + 1;
            } while (sVar18 <= (ulong)((long)*(pointer *)
                                              ((long)&pvVar12[lVar3].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar12[lVar3].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2));
            pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          if (*(pointer *)
               ((long)&pvVar14[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar14[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            sVar18 = 1;
            local_40 = uVar15;
            do {
              if (*(pointer *)
                   ((long)&pvVar12[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                  != *(pointer *)
                      &pvVar12[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
                uVar13 = (ulong)((int)sVar18 - 1);
                col = 1;
                uVar8 = 2;
                local_38 = sVar18;
                do {
                  plVar2 = &(this->
                            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
                            ).subproblem_counter_;
                  *plVar2 = *plVar2 + 1;
                  uVar15 = (ulong)(uVar8 - 2);
                  pdVar10 = data_structures::Matrix<double>::at(this_02,sVar18,uVar15);
                  dVar19 = *pdVar10;
                  pdVar10 = data_structures::Matrix<double>::at
                                      (this_00,0,
                                       (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                postl_to_children_.
                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4) + 1);
                  dVar4 = *pdVar10;
                  pdVar10 = data_structures::Matrix<double>::at(this_02,uVar13,col);
                  dVar5 = *pdVar10;
                  pdVar10 = data_structures::Matrix<double>::at
                                      (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar13 * 4) + 1,0);
                  dVar20 = *pdVar10;
                  pdVar10 = data_structures::Matrix<double>::at(this_02,uVar13,uVar15);
                  local_68 = *pdVar10;
                  uStack_60 = 0;
                  pdVar10 = data_structures::Matrix<double>::at
                                      (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar13 * 4) + 1,
                                       (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                postl_to_children_.
                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar15 * 4) + 1);
                  local_78 = *pdVar10;
                  pdVar10 = data_structures::Matrix<double>::at(this_02,sVar18,col);
                  uVar15 = -(ulong)(dVar5 + dVar20 <= dVar19 + dVar4);
                  dVar19 = (double)(~uVar15 & (ulong)(dVar19 + dVar4) |
                                   (ulong)(dVar5 + dVar20) & uVar15);
                  uVar15 = -(ulong)(local_68 + local_78 <= dVar19);
                  *pdVar10 = (double)(uVar15 & (ulong)(local_68 + local_78) |
                                     ~uVar15 & (ulong)dVar19);
                  pvVar12 = (t2->super_PostLToChildren).postl_to_children_.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  col = (size_t)uVar8;
                  uVar8 = uVar8 + 1;
                } while (col <= (ulong)((long)*(pointer *)
                                               ((long)&pvVar12[lVar3].
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl + 8) -
                                        *(long *)&pvVar12[lVar3].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl >> 2));
                pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                sVar18 = local_38;
                uVar15 = local_40;
              }
              sVar18 = (size_t)((int)sVar18 + 1);
            } while (sVar18 <= (ulong)((long)*(pointer *)
                                              ((long)&pvVar14[lVar1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar14[lVar1].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2));
          }
          pdVar10 = data_structures::Matrix<double>::at(this_01,0,uVar15);
          uVar13 = local_48;
          dVar19 = *pdVar10;
          dVar4 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15];
          pdVar10 = data_structures::Matrix<double>::at(this_01,local_48,0);
          dVar5 = *pdVar10;
          pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
          local_68 = *pdVar10;
          pvVar14 = (t1->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar12 = (t2->super_PostLToChildren).postl_to_children_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar10 = data_structures::Matrix<double>::at
                              (this_02,(long)*(pointer *)
                                              ((long)&pvVar14[lVar1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar14[lVar1].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2,
                               (long)*(pointer *)
                                      ((long)&pvVar12[lVar3].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) -
                               *(long *)&pvVar12[lVar3].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2)
          ;
          local_78 = *pdVar10;
          uStack_70 = 0;
          pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
          uVar16 = -(ulong)(dVar5 + local_68 <= dVar19 + dVar4);
          dVar19 = (double)(~uVar16 & (ulong)(dVar19 + dVar4) | (ulong)(dVar5 + local_68) & uVar16);
          uVar16 = -(ulong)(local_78 <= dVar19);
          *pdVar10 = (double)(uVar16 & (ulong)local_78 | ~uVar16 & (ulong)dVar19);
          pdVar10 = data_structures::Matrix<double>::at(this_00,0,uVar15);
          dVar19 = *pdVar10;
          dVar4 = *(double *)(local_b8._0_8_ + uVar15 * 8);
          pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,0);
          dVar5 = *pdVar10;
          pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
          local_68 = *pdVar10;
          pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
          local_78 = *pdVar10;
          uStack_70 = 0;
          iVar33 = (t1->super_PostLToLabelId).postl_to_label_id_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar13 - 1];
          iVar34 = (t2->super_PostLToLabelId).postl_to_label_id_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar15 - 1];
          pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
          dVar20 = 0.0;
          if (iVar33 != iVar34) {
            dVar20 = 1.0;
          }
          uVar16 = -(ulong)(dVar5 + local_68 <= dVar19 + dVar4);
          dVar19 = (double)(~uVar16 & (ulong)(dVar19 + dVar4) | (ulong)(dVar5 + local_68) & uVar16);
          uVar16 = -(ulong)(local_78 + dVar20 <= dVar19);
          *pdVar10 = (double)(uVar16 & (ulong)(local_78 + dVar20) | ~uVar16 & (ulong)dVar19);
          if (-1 < (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar15 - 1]) {
            pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
            dVar19 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at(this_01,0,uVar15);
            if (dVar19 - *pdVar10 <
                local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)(t2->super_PostLToParent).postl_to_parent_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar15 - 1] + 1]) {
              pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_01,0,uVar15);
              local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)(t2->super_PostLToParent).postl_to_parent_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar15 - 1] + 1] = dVar19 - *pdVar10;
            }
            pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
            dVar19 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at(this_00,0,uVar15);
            if (dVar19 - *pdVar10 <
                *(double *)
                 (local_b8._0_8_ +
                 ((long)(t2->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15 - 1] + 1) * 8)) {
              pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_00,0,uVar15);
              *(double *)
               (local_b8._0_8_ +
               ((long)(t2->super_PostLToParent).postl_to_parent_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar15 - 1] + 1) * 8) = dVar19 - *pdVar10;
            }
          }
          if (-1 < (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar13 - 1]) {
            pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
            dVar19 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,0);
            dVar4 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at
                                (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar13 - 1] + 1,
                                 uVar15);
            if (dVar19 - dVar4 < *pdVar10) {
              pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,uVar15);
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_01,uVar13,0);
              dVar4 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [uVar13 - 1] + 1,uVar15);
              *pdVar10 = dVar19 - dVar4;
            }
            pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
            dVar19 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,0);
            dVar4 = *pdVar10;
            pdVar10 = data_structures::Matrix<double>::at
                                (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar13 - 1] + 1,
                                 uVar15);
            if (dVar19 - dVar4 < *pdVar10) {
              pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,uVar15);
              dVar19 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at(this_00,uVar13,0);
              dVar4 = *pdVar10;
              pdVar10 = data_structures::Matrix<double>::at
                                  (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [uVar13 - 1] + 1,uVar15);
              *pdVar10 = dVar19 - dVar4;
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_50);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_58);
  }
  pdVar10 = data_structures::Matrix<double>::at(this_00,local_c8,local_c0);
  dVar19 = *pdVar10;
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_a8._0_8_ - local_b8._0_8_);
  }
  return dVar19;
}

Assistant:

double CTEDTreeIndex<CostModel, TreeIndex>::ted(const TreeIndex& t1, const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  
  // Initialise distance matrices.
  
  // TODO: Verify if a move assignment operator is used here.
  dt_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e_.fill_with(std::numeric_limits<double>::infinity());
  
  std::vector<double> dt2(t2_input_size + 1);
  std::vector<double> df2(t2_input_size + 1);
  
  double a = -1;
  double b = -1;
  double c = -1;
  
  dt_.at(0, 0) = 0;
  df_.at(0, 0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    df_.at(i, 0) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      df_.at(i, 0) += dt_.at(t1.postl_to_children_[i-1][k-1] + 1, 0);
    }
    dt_.at(i, 0) = df_.at(i, 0) + c_.del(t1.postl_to_label_id_[i - 1]);
  }
  for (int j = 1; j <= t2_input_size; ++j) {
    df_.at(0, j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      df_.at(0, j) += dt_.at(0, t2.postl_to_children_[j-1][k-1] + 1);
    }
    dt_.at(0, j) = df_.at(0, j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  for (int i = 1; i <= t1_input_size; ++i) {
    std::fill(dt2.begin(), dt2.end(), std::numeric_limits<double>::infinity());
    std::fill(df2.begin(), df2.end(), std::numeric_limits<double>::infinity());
    
    for (int j = 1; j <= t2_input_size; ++j) {
      e_.at(0, 0) = 0;
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        e_.at(s, 0) = e_.at(s-1, 0) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0); // here we access d for subtree rooted in the s'th child of node i AND s starts with 1 but the postorder of the first child of node i is children1[i][s-1]
      }
      for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
        e_.at(0, t) = e_.at(0, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
      }
      
      // TODO: but we already went over each pair of children
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
          ++subproblem_counter_;
          a = e_.at(s, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
          b = e_.at(s-1, t) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0);
          c = e_.at(s-1, t-1) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, t2.postl_to_children_[j-1][t-1] + 1); // TODO: This is a problematic part to reduce the memory. This requires to store distance for each pair of children of i and j.
          e_.at(s, t) = a >= b ? b >= c ? c : b : a >= c ? c : a;
        }
      }
      
      a = df_.at(0, j) + df2[j];
      b = df_.at(i, 0) + df_.at(i, j);
      c = e_.at(t1.postl_to_children_[i-1].size(), t2.postl_to_children_[j-1].size());
      
      df_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      a = dt_.at(0, j) + dt2[j];
      b = dt_.at(i, 0) + dt_.at(i, j);
      c = df_.at(i, j) + c_.ren(t1.postl_to_label_id_[i - 1], t2.postl_to_label_id_[j - 1]);
      
      dt_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      if (t2.postl_to_parent_[j-1] > -1) {
        if (df_.at(i, j) - df_.at(0, j) < df2[t2.postl_to_parent_[j-1]+1]) {
          df2[t2.postl_to_parent_[j-1]+1] = df_.at(i, j) - df_.at(0, j);
        }
        if (dt_.at(i, j) - dt_.at(0, j) < dt2[t2.postl_to_parent_[j-1]+1]) {
          dt2[t2.postl_to_parent_[j-1]+1] = dt_.at(i, j) - dt_.at(0, j);
        }
      }
      if (t1.postl_to_parent_[i-1] > -1) {
        if (df_.at(i, j) - df_.at(i, 0) < df_.at(t1.postl_to_parent_[i-1]+1, j)) {
          df_.at(t1.postl_to_parent_[i-1]+1, j) = df_.at(i, j) - df_.at(i, 0);
        }
        if (dt_.at(i, j) - dt_.at(i, 0) < dt_.at(t1.postl_to_parent_[i-1]+1, j)) {
          dt_.at(t1.postl_to_parent_[i-1]+1, j) = dt_.at(i, j) - dt_.at(i, 0);
        }
      }
    }
  }

  return dt_.at(t1_input_size, t2_input_size);
}